

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

WordEmbedding *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::CoreMLModels::WordEmbedding>
          (Arena *arena)

{
  WordEmbedding *this;
  
  if (arena == (Arena *)0x0) {
    this = (WordEmbedding *)operator_new(0x28);
    CoreML::Specification::CoreMLModels::WordEmbedding::WordEmbedding(this,(Arena *)0x0,false);
  }
  else {
    this = (WordEmbedding *)
           AllocateAlignedWithHook
                     (arena,0x28,
                      (type_info *)&CoreML::Specification::CoreMLModels::WordEmbedding::typeinfo);
    CoreML::Specification::CoreMLModels::WordEmbedding::WordEmbedding(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }